

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Face.cpp
# Opt level: O2

shared_ptr<Face> __thiscall Face::get_sending_neighbor(Face *this,Corner corner,Direction dir)

{
  long lVar1;
  int in_ECX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Direction dir_00;
  undefined4 in_register_00000034;
  long lVar2;
  char *this_00;
  shared_ptr<Face> sVar3;
  shared_ptr<Face> sVar4;
  
  lVar2 = CONCAT44(in_register_00000034,corner);
  switch(dir) {
  case clockwise:
    lVar1 = (ulong)(in_ECX == 0) * 0x10 + 0xf8;
    break;
  case counterclockwise:
    lVar1 = (ulong)(in_ECX == 0) * 0x10 + 0x118;
    break;
  case 2:
    lVar1 = (ulong)(in_ECX == 0) * 0x10 + 0x138;
    break;
  case 3:
    lVar1 = (ulong)(in_ECX == 0) * 0x10 + 0x158;
    break;
  default:
    this_00 = "Invalid move specified";
    printf("Invalid move specified");
    sVar4 = get_sending_neighbor((Face *)this_00,(Corner)lVar2,dir_00);
    sVar4.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this_00;
    return (shared_ptr<Face>)sVar4.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2> *)(lVar2 + lVar1));
  sVar3.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Face>)sVar3.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Face> Face::get_sending_neighbor(Corner corner, Direction dir){
    switch (corner)
    {
    case Corner::U:
        if(dir == Direction::clockwise){
            return neighbors.U_neighbor_right;
        }
        else{
            return neighbors.U_neighbor_left;
        }
        break;
    case Corner::L:
        if(dir == Direction::clockwise){
            return neighbors.L_neighbor_right;
        }
        else{
            return neighbors.L_neighbor_left;
        }
        break;
    case Corner::R:
        if(dir == Direction::clockwise){
            return neighbors.R_neighbor_right;
        }
        else{
            return neighbors.R_neighbor_left;
        }
        break;
    case Corner::B:
        if(dir == Direction::clockwise){
            return neighbors.B_neighbor_right;
        }
        else{
            return neighbors.B_neighbor_left;
        }
        break;
    default:
        printf("Invalid move specified");
        break;
    }
}